

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O3

ssize_t chrono::ChBezierCurve::read(int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  char cVar2;
  char cVar3;
  istream *piVar4;
  ChBezierCurve *pCVar5;
  ChException *this;
  undefined8 *puVar6;
  undefined4 in_register_0000003c;
  ulong uVar7;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> points;
  size_t numPoints;
  string line;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> inCV;
  double y;
  double z;
  double x;
  double outZ;
  double outY;
  double outX;
  double inZ;
  double inY;
  double inX;
  double z_1;
  double y_1;
  size_t numCols;
  ifstream ifile;
  istringstream jss;
  istringstream iss;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_668;
  ulong local_650;
  undefined1 *local_648;
  undefined8 local_640;
  undefined1 local_638;
  undefined7 uStack_637;
  ChVector<double> local_628;
  ChVector<double> local_608;
  double local_5f0;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_5e8;
  undefined8 *local_5c8;
  double local_5c0;
  double local_5b8;
  double local_5b0;
  double local_5a8;
  double local_5a0;
  double local_598;
  double local_590;
  double local_588;
  long local_580;
  string local_578 [2];
  long local_538 [3];
  undefined4 auStack_51c [123];
  istringstream local_330 [120];
  ios_base local_2b8 [264];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  puVar6 = (undefined8 *)CONCAT44(in_register_0000003c,__fd);
  std::ifstream::ifstream(local_538);
  local_648 = &local_638;
  local_640 = 0;
  local_638 = 0;
  lVar1 = *(long *)(local_538[0] + -0x18);
  *(undefined4 *)((long)auStack_51c + lVar1) = 7;
  std::ios::clear((int)local_538 + (int)lVar1);
  std::ifstream::open((char *)local_538,(_Ios_Openmode)*__buf);
  cVar2 = std::ios::widen((char)local_538 + (char)*(undefined8 *)(local_538[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_538,(string *)&local_648,cVar2);
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_648,_S_in);
  piVar4 = std::istream::_M_extract<unsigned_long>((ulong *)local_1b0);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar4);
  cVar2 = (char)(istream *)local_538;
  local_5c8 = puVar6;
  if (local_580 == 9) {
    local_668.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_628.m_data[2] = 0.0;
    local_5e8.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_668.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_668.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_628.m_data[0] = 0.0;
    local_628.m_data[1] = 0.0;
    local_5e8.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_5e8.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    if (local_650 != 0) {
      uVar7 = 0;
      do {
        cVar3 = std::ios::widen((char)*(undefined8 *)(local_538[0] + -0x18) + cVar2);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_538,(string *)&local_648,cVar3);
        std::__cxx11::istringstream::istringstream(local_330,(string *)&local_648,_S_in);
        piVar4 = std::istream::_M_extract<double>((double *)local_330);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        std::istream::_M_extract<double>((double *)piVar4);
        local_608.m_data[0] = local_5f0;
        local_608.m_data[1] = local_588;
        local_608.m_data[2] = local_590;
        std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
        emplace_back<chrono::ChVector<double>>
                  ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
                   &local_668,&local_608);
        local_608.m_data[0] = local_598;
        local_608.m_data[1] = local_5a0;
        local_608.m_data[2] = local_5a8;
        std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
        emplace_back<chrono::ChVector<double>>
                  ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
                   &local_628,&local_608);
        local_608.m_data[0] = local_5b0;
        local_608.m_data[1] = local_5b8;
        local_608.m_data[2] = local_5c0;
        std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
        emplace_back<chrono::ChVector<double>>
                  ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
                   &local_5e8,&local_608);
        std::__cxx11::istringstream::~istringstream(local_330);
        std::ios_base::~ios_base(local_2b8);
        uVar7 = uVar7 + 1;
      } while (uVar7 < local_650);
    }
    std::ifstream::close();
    puVar6 = local_5c8;
    pCVar5 = (ChBezierCurve *)::operator_new(0x48);
    ChBezierCurve(pCVar5,&local_668,
                  (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
                  &local_628,&local_5e8);
    *puVar6 = pCVar5;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBezierCurve*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar6 + 1),pCVar5);
    if (local_5e8.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5e8.
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_5e8.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_5e8.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_628.m_data[0] != (pointer)0x0) {
      operator_delete((void *)local_628.m_data[0],
                      (long)local_628.m_data[2] - (long)local_628.m_data[0]);
    }
  }
  else {
    if (local_580 != 3) {
      std::ifstream::close();
      this = (ChException *)__cxa_allocate_exception(0x28);
      local_578[0]._M_dataplus._M_p = (pointer)&local_578[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"Invalid input file","");
      ChException::ChException(this,local_578);
      __cxa_throw(this,&ChException::typeinfo,ChException::~ChException);
    }
    local_668.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_668.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_668.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    if (local_650 != 0) {
      uVar7 = 0;
      do {
        cVar3 = std::ios::widen((char)*(undefined8 *)(local_538[0] + -0x18) + cVar2);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_538,(string *)&local_648,cVar3);
        std::__cxx11::istringstream::istringstream(local_330,(string *)&local_648,_S_in);
        piVar4 = std::istream::_M_extract<double>((double *)local_330);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        std::istream::_M_extract<double>((double *)piVar4);
        local_628.m_data[0] =
             (double)local_5e8.
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        local_628.m_data[1] = local_608.m_data[0];
        local_628.m_data[2] = local_5f0;
        std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
        emplace_back<chrono::ChVector<double>>
                  ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
                   &local_668,&local_628);
        std::__cxx11::istringstream::~istringstream(local_330);
        std::ios_base::~ios_base(local_2b8);
        uVar7 = uVar7 + 1;
      } while (uVar7 < local_650);
    }
    std::ifstream::close();
    puVar6 = local_5c8;
    pCVar5 = (ChBezierCurve *)::operator_new(0x48);
    ChBezierCurve(pCVar5,&local_668);
    *puVar6 = pCVar5;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBezierCurve*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar6 + 1),pCVar5);
  }
  if (local_668.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_668.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_668.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_668.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_648 != &local_638) {
    operator_delete(local_648,CONCAT71(uStack_637,local_638) + 1);
  }
  std::ifstream::~ifstream(local_538);
  return (ssize_t)puVar6;
}

Assistant:

std::shared_ptr<ChBezierCurve> ChBezierCurve::read(const std::string& filename) {
    // Open input file stream
    std::ifstream ifile;
    std::string line;
    try {
        ifile.exceptions(std::ios::failbit | std::ios::badbit | std::ios::eofbit);
        ifile.open(filename.c_str());
    } catch (const std::exception &) {
        throw ChException("Cannot open input file");
    }

    // Read number of knots and type of curve
    size_t numPoints;
    size_t numCols;

    std::getline(ifile, line);
    std::istringstream iss(line);
    iss >> numPoints >> numCols;

    if (numCols == 3) {
        // Read knots from the following numPoints lines
        std::vector<ChVector<> > points;

        for (size_t i = 0; i < numPoints; i++) {
            double x, y, z;

            std::getline(ifile, line);
            std::istringstream jss(line);
            jss >> x >> y >> z;

            points.push_back(ChVector<>(x, y, z));
        }

        ifile.close();
        return std::shared_ptr<ChBezierCurve>(new ChBezierCurve(points));
    }

    if (numCols == 9) {
        // Read knots and control points from the following numPoints lines
        std::vector<ChVector<> > points;
        std::vector<ChVector<> > inCV;
        std::vector<ChVector<> > outCV;

        for (size_t i = 0; i < numPoints; i++) {
            double x, y, z;
            double inX, inY, inZ;
            double outX, outY, outZ;

            std::getline(ifile, line);
            std::istringstream jss(line);
            jss >> x >> y >> z >> inX >> inY >> inZ >> outX >> outY >> outZ;

            points.push_back(ChVector<>(x, y, z));
            inCV.push_back(ChVector<>(inX, inY, inZ));
            outCV.push_back(ChVector<>(outX, outY, outZ));
        }

        ifile.close();
        return std::shared_ptr<ChBezierCurve>(new ChBezierCurve(points, inCV, outCV));
    }

    // Not the expected number of columns.  Close the file and throw an exception.
    ifile.close();
    throw ChException("Invalid input file");
}